

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<std::pair<unsigned_long,unsigned_long>>::
emplaceRealloc<std::pair<unsigned_long,unsigned_long>>
          (SmallVectorBase<std::pair<unsigned_long,unsigned_long>> *this,pointer pos,
          pair<unsigned_long,_unsigned_long> *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type capacity;
  iterator ppVar3;
  pair<unsigned_long,_unsigned_long> *__result;
  pair<unsigned_long,_unsigned_long> *ppVar4;
  iterator __first;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  pair<unsigned_long,_unsigned_long> *args_local;
  pointer pos_local;
  SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_> *this_local;
  
  sVar1 = *(size_type *)(this + 8);
  sVar2 = SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>::max_size
                    ((SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_> *)this);
  if (sVar1 == sVar2) {
    slang::detail::throwLengthError();
  }
  capacity = SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>::calculateGrowth
                       ((SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_> *)this,
                        *(long *)(this + 8) + 1);
  ppVar3 = SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>::begin
                     ((SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_> *)this);
  __result = (pair<unsigned_long,_unsigned_long> *)slang::detail::allocArray(capacity,0x10);
  ppVar4 = __result + ((long)pos - (long)ppVar3 >> 4);
  ppVar4->first = args->first;
  ppVar4->second = args->second;
  ppVar3 = SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>::end
                     ((SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_> *)this);
  if (pos == ppVar3) {
    __first = SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>::begin
                        ((SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_> *)this);
    ppVar3 = SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>::end
                       ((SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_> *)this);
    std::
    uninitialized_move<std::pair<unsigned_long,unsigned_long>*,std::pair<unsigned_long,unsigned_long>*>
              (__first,ppVar3,__result);
  }
  else {
    ppVar3 = SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>::begin
                       ((SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_> *)this);
    std::
    uninitialized_move<std::pair<unsigned_long,unsigned_long>*,std::pair<unsigned_long,unsigned_long>*>
              (ppVar3,pos,__result);
    ppVar3 = SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>::end
                       ((SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_> *)this);
    std::
    uninitialized_move<std::pair<unsigned_long,unsigned_long>*,std::pair<unsigned_long,unsigned_long>*>
              (pos,ppVar3,ppVar4 + 1);
  }
  SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>::cleanup
            ((SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_> *)this,
             (EVP_PKEY_CTX *)ppVar3);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(size_type *)(this + 0x10) = capacity;
  *(pair<unsigned_long,_unsigned_long> **)this = __result;
  return ppVar4;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}